

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_dc_top_predictor_64x32_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  uint6 uVar2;
  ulong uVar3;
  undefined1 auVar4 [11];
  undefined1 auVar5 [13];
  int iVar6;
  uint8_t *puVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  ushort uVar16;
  ushort uVar18;
  ushort uVar19;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar20;
  undefined1 auVar14 [16];
  undefined1 auVar21 [16];
  undefined1 uVar15;
  byte bVar17;
  
  auVar12 = psadbw(*(undefined1 (*) [16])above,(undefined1  [16])0x0);
  auVar21 = psadbw(*(undefined1 (*) [16])(above + 0x10),(undefined1  [16])0x0);
  auVar13 = psadbw(*(undefined1 (*) [16])(above + 0x20),(undefined1  [16])0x0);
  auVar9 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(above + 0x30));
  auVar10._0_2_ = auVar9._0_2_ + auVar13._0_2_ + auVar21._0_2_ + auVar12._0_2_;
  auVar10._2_2_ = auVar9._2_2_ + auVar13._2_2_ + auVar21._2_2_ + auVar12._2_2_;
  auVar10._4_2_ = auVar9._4_2_ + auVar13._4_2_ + auVar21._4_2_ + auVar12._4_2_;
  auVar10._6_2_ = auVar9._6_2_ + auVar13._6_2_ + auVar21._6_2_ + auVar12._6_2_;
  auVar10._8_2_ = auVar9._8_2_ + auVar13._8_2_ + auVar21._8_2_ + auVar12._8_2_;
  auVar10._10_2_ = auVar9._10_2_ + auVar13._10_2_ + auVar21._10_2_ + auVar12._10_2_;
  auVar10._12_2_ = auVar9._12_2_ + auVar13._12_2_ + auVar21._12_2_ + auVar12._12_2_;
  auVar10._14_2_ = auVar9._14_2_ + auVar13._14_2_ + auVar21._14_2_ + auVar12._14_2_;
  uVar11 = auVar10._8_2_ + auVar10._0_2_ + 0x20;
  uVar16 = auVar10._10_2_ + auVar10._2_2_ + 0x20;
  uVar18 = auVar10._12_2_ + auVar10._4_2_ + 0x20;
  uVar19 = auVar10._14_2_ + auVar10._6_2_ + 0x20;
  auVar12._0_2_ = uVar11 >> 6;
  uVar20 = uVar19 >> 6;
  uVar1 = CONCAT22((ushort)(auVar10._8_2_ * 2 + 0x20U) >> 6,uVar20);
  auVar13._0_9_ = (unkuint9)uVar1 << 0x30;
  uVar2 = CONCAT24((ushort)(auVar10._10_2_ * 2 + 0x20U) >> 6,uVar1);
  auVar4._6_5_ = 0;
  auVar4._0_6_ = uVar2;
  auVar21._0_11_ = auVar4 << 0x30;
  uVar3 = CONCAT26((ushort)(auVar10._12_2_ * 2 + 0x20U) >> 6,uVar2);
  auVar5._8_5_ = 0;
  auVar5._0_8_ = uVar3;
  auVar14._0_13_ = auVar5 << 0x30;
  bVar17 = (byte)(uVar19 >> 8);
  auVar14._14_2_ = (undefined2)(CONCAT19(bVar17 >> 6,CONCAT18(bVar17 >> 6,uVar3)) >> 0x40);
  auVar14[0xd] = (char)uVar20;
  bVar17 = (byte)(uVar18 >> 0xe);
  auVar21._12_4_ = (undefined4)(CONCAT37(auVar14._13_3_,CONCAT16((char)uVar20,uVar2)) >> 0x30);
  auVar21[0xb] = bVar17;
  uVar15 = (undefined1)(uVar18 >> 6);
  auVar13._10_6_ = (undefined6)(CONCAT55(auVar21._11_5_,CONCAT14(bVar17,uVar1)) >> 0x20);
  auVar13[9] = uVar15;
  bVar17 = (byte)(uVar16 >> 0xe);
  auVar12._8_8_ = (undefined8)(CONCAT73(auVar13._9_7_,CONCAT12(uVar15,uVar20)) >> 0x10);
  auVar12[7] = bVar17;
  auVar12[6] = bVar17;
  uVar15 = (undefined1)(uVar16 >> 6);
  auVar12[5] = uVar15;
  auVar12[4] = uVar15;
  bVar17 = (byte)(uVar11 >> 8);
  auVar12[3] = bVar17 >> 6;
  auVar12[2] = bVar17 >> 6;
  auVar9[0] = (undefined1)auVar12._0_2_;
  auVar9._2_14_ = auVar12._2_14_;
  auVar9[1] = auVar9[0];
  auVar9 = pshuflw(auVar10,auVar9,0);
  uVar8 = auVar9._0_4_;
  puVar7 = dst + 0x30;
  iVar6 = 0x20;
  do {
    *(undefined4 *)(puVar7 + -0x30) = uVar8;
    *(undefined4 *)(puVar7 + -0x2c) = uVar8;
    *(undefined4 *)(puVar7 + -0x28) = uVar8;
    *(undefined4 *)(puVar7 + -0x24) = uVar8;
    *(undefined4 *)(puVar7 + -0x20) = uVar8;
    *(undefined4 *)(puVar7 + -0x1c) = uVar8;
    *(undefined4 *)(puVar7 + -0x18) = uVar8;
    *(undefined4 *)(puVar7 + -0x14) = uVar8;
    *(undefined4 *)(puVar7 + -0x10) = uVar8;
    *(undefined4 *)(puVar7 + -0xc) = uVar8;
    *(undefined4 *)(puVar7 + -8) = uVar8;
    *(undefined4 *)(puVar7 + -4) = uVar8;
    *(undefined4 *)puVar7 = uVar8;
    *(undefined4 *)(puVar7 + 4) = uVar8;
    *(undefined4 *)(puVar7 + 8) = uVar8;
    *(undefined4 *)(puVar7 + 0xc) = uVar8;
    puVar7 = puVar7 + stride;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

static inline __m128i dc_sum_64(const uint8_t *ref) {
  __m128i x0 = _mm_load_si128((__m128i const *)ref);
  __m128i x1 = _mm_load_si128((__m128i const *)(ref + 16));
  __m128i x2 = _mm_load_si128((__m128i const *)(ref + 32));
  __m128i x3 = _mm_load_si128((__m128i const *)(ref + 48));
  const __m128i zero = _mm_setzero_si128();
  x0 = _mm_sad_epu8(x0, zero);
  x1 = _mm_sad_epu8(x1, zero);
  x2 = _mm_sad_epu8(x2, zero);
  x3 = _mm_sad_epu8(x3, zero);
  x0 = _mm_add_epi16(x0, x1);
  x2 = _mm_add_epi16(x2, x3);
  x0 = _mm_add_epi16(x0, x2);
  const __m128i high = _mm_unpackhi_epi64(x0, x0);
  return _mm_add_epi16(x0, high);
}